

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStl.h
# Opt level: O0

string * __thiscall
Corrade::Containers::Implementation::
StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::to(string *__return_storage_ptr__,
    StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *this,StringView other)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_21;
  undefined1 local_20 [8];
  StringView other_local;
  
  other_local._data = other._data;
  local_20 = (undefined1  [8])this;
  other_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  pcVar1 = BasicStringView<const_char>::data((BasicStringView<const_char> *)local_20);
  sVar2 = BasicStringView<const_char>::size((BasicStringView<const_char> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

CORRADE_STRING_STL_INLINE std::string StringViewConverter<const char, std::string>::to(StringView other) {
    return std::string{other.data(), other.size()};
}